

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  bool local_1da;
  bool local_192;
  allocator local_179;
  string local_178;
  bool local_152;
  allocator local_151;
  undefined1 local_150 [6];
  bool finalizeTokenOk;
  undefined1 local_130 [8];
  Token comma;
  Value *pVStack_110;
  bool ok;
  Value *local_108;
  Value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  Token colon;
  bool local_75;
  bool initialTokenOk;
  Value local_68;
  undefined1 local_58 [8];
  string name;
  Token tokenName;
  Token *tokenStart_local;
  Reader *this_local;
  
  std::__cxx11::string::string((string *)local_58);
  Value::Value(&local_68,objectValue);
  pVVar2 = currentValue(this);
  Value::operator=(pVVar2,&local_68);
  Value::~Value(&local_68);
  do {
    bVar1 = readToken(this,(Token *)((long)&name.field_2 + 8));
    if (!bVar1) {
LAB_0031242d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_178,"Missing \'}\' or object member name",&local_179);
      this_local._7_1_ =
           addErrorAndRecover(this,&local_178,(Token *)((long)&name.field_2 + 8),tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      goto LAB_003124e0;
    }
    local_75 = true;
    while( true ) {
      local_192 = false;
      if (name.field_2._8_4_ == 0xd) {
        local_192 = local_75;
      }
      if (local_192 == false) break;
      local_75 = readToken(this,(Token *)((long)&name.field_2 + 8));
    }
    if (local_75 == false) goto LAB_0031242d;
    if ((name.field_2._8_4_ == 2) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      this_local._7_1_ = true;
      goto LAB_003124e0;
    }
    if (name.field_2._8_4_ != 5) goto LAB_0031242d;
    std::__cxx11::string::operator=((string *)local_58,"");
    bVar1 = decodeString(this,(Token *)((long)&name.field_2 + 8),(string *)local_58);
    if (!bVar1) {
      this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      goto LAB_003124e0;
    }
    bVar1 = readToken(this,(Token *)local_98);
    if ((!bVar1) || (local_98._0_4_ != tokenMemberSeparator)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b8,"Missing \':\' after object member name",&local_b9);
      this_local._7_1_ = addErrorAndRecover(this,&local_b8,(Token *)local_98,tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      goto LAB_003124e0;
    }
    pVVar2 = currentValue(this);
    bVar1 = Value::isMember(pVVar2,(string *)local_58);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                     "Key \'",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58);
      std::operator+(&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                     "\' appears twice.");
      this_local._7_1_ = addError(this,&local_e0,(Token *)((long)&name.field_2 + 8),(Location)0x0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&value);
      goto LAB_003124e0;
    }
    pVVar2 = currentValue(this);
    pVStack_110 = Value::operator[](pVVar2,(string *)local_58);
    local_108 = pVStack_110;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              (&this->nodes_,&stack0xfffffffffffffef0);
    comma.end_._7_1_ = readValue(this);
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              (&this->nodes_);
    if ((comma.end_._7_1_ & 1) == 0) {
      this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      goto LAB_003124e0;
    }
    bVar1 = readToken(this,(Token *)local_130);
    if ((!bVar1) ||
       (((local_130._0_4_ != tokenObjectEnd && (local_130._0_4_ != tokenArraySeparator)) &&
        (local_130._0_4_ != tokenComment)))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_150,"Missing \',\' or \'}\' in object declaration",&local_151);
      this_local._7_1_ =
           addErrorAndRecover(this,(string *)local_150,(Token *)local_130,tokenObjectEnd);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      goto LAB_003124e0;
    }
    local_152 = true;
    while( true ) {
      local_1da = false;
      if (local_130._0_4_ == tokenComment) {
        local_1da = local_152;
      }
      if (local_1da == false) break;
      local_152 = readToken(this,(Token *)local_130);
    }
  } while (local_130._0_4_ != tokenObjectEnd);
  this_local._7_1_ = true;
LAB_003124e0:
  colon.end_._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool
Reader::readObject ( Token& tokenStart )
{
    Token tokenName;
    std::string name;
    currentValue () = Value ( objectValue );

    while ( readToken ( tokenName ) )
    {
        bool initialTokenOk = true;

        while ( tokenName.type_ == tokenComment  &&  initialTokenOk )
            initialTokenOk = readToken ( tokenName );

        if  ( !initialTokenOk )
            break;

        if ( tokenName.type_ == tokenObjectEnd  &&  name.empty () ) // empty object
            return true;

        if ( tokenName.type_ != tokenString )
            break;

        name = "";

        if ( !decodeString ( tokenName, name ) )
            return recoverFromError ( tokenObjectEnd );

        Token colon;

        if ( !readToken ( colon ) ||  colon.type_ != tokenMemberSeparator )
        {
            return addErrorAndRecover ( "Missing ':' after object member name",
                                        colon,
                                        tokenObjectEnd );
        }

        // Reject duplicate names
        if (currentValue ().isMember (name))
            return addError ( "Key '" + name + "' appears twice.", tokenName );

        Value& value = currentValue ()[ name ];
        nodes_.push ( &value );
        bool ok = readValue ();
        nodes_.pop ();

        if ( !ok ) // error already set
            return recoverFromError ( tokenObjectEnd );

        Token comma;

        if ( !readToken ( comma )
                ||  ( comma.type_ != tokenObjectEnd  &&
                      comma.type_ != tokenArraySeparator &&
                      comma.type_ != tokenComment ) )
        {
            return addErrorAndRecover ( "Missing ',' or '}' in object declaration",
                                        comma,
                                        tokenObjectEnd );
        }

        bool finalizeTokenOk = true;

        while ( comma.type_ == tokenComment &&
                finalizeTokenOk )
            finalizeTokenOk = readToken ( comma );

        if ( comma.type_ == tokenObjectEnd )
            return true;
    }

    return addErrorAndRecover ( "Missing '}' or object member name",
                                tokenName,
                                tokenObjectEnd );
}